

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
SetAttributes(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
              *this,DynamicObject *instance,PropertyId propertyId,PropertyAttributes attributes)

{
  PropertyAttributes attributes_00;
  code *pcVar1;
  int propertyKey;
  Type instance_00;
  bool bVar2;
  uint32 index;
  BOOL BVar3;
  DynamicType *pDVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_02;
  undefined1 local_48 [16];
  JavascriptLibrary *library;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyAttributes attributes_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_local;
  
  descriptor._3_1_ = attributes;
  descriptor._4_4_ = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
  if (bVar2) {
    this_02 = ConvertToNonSharedSimpleDictionaryType(this,(DynamicObject *)TStack_20.ptr);
    BVar3 = SetAttributes(this_02,(DynamicObject *)TStack_20.ptr,descriptor._4_4_,descriptor._3_1_);
    return BVar3;
  }
  pDVar4 = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
  bVar2 = DynamicType::GetIsLocked(pDVar4);
  if (!bVar2) goto LAB_0143ec83;
  bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
  if (bVar2) {
LAB_0143ec0d:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa1a,
                                "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  else {
    pDVar4 = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
    bVar2 = DynamicType::GetIsShared(pDVar4);
    if (bVar2) goto LAB_0143ec0d;
  }
  DynamicObject::ChangeType((DynamicObject *)TStack_20.ptr);
LAB_0143ec83:
  if (descriptor._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa21,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
  library = (JavascriptLibrary *)ScriptContext::GetPropertyName(pSVar6,descriptor._4_4_);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&library,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
  if (bVar2) {
    if ((descriptor._3_1_ & 0x10) != 0) {
      if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 0x1000) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa27,"(!(descriptor->Attributes & 0x10))",
                                    "!(descriptor->Attributes & PropertyLetConstGlobal)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      Throw::NotImplemented();
    }
    if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x1000) != 0) {
      if ((descriptor._3_1_ & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa2e,"(!(attributes & 0x10))",
                                    "!(attributes & PropertyLetConstGlobal)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xa2f,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x800) == 0) {
      *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject + 1) =
           *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject + 1) & 0xf8 | descriptor._3_1_ & 7;
      if ((descriptor._3_1_ & 1) != 0) {
        DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)TStack_20.ptr,false);
      }
      local_48._8_8_ = RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
      JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                ((JavascriptLibrary *)local_48);
      this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                            *)local_48);
      propertyKey = descriptor._4_4_;
      attributes_00 =
           *(PropertyAttributes *)
            ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject + 1);
      pSVar6 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)local_48._8_8_);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                (this_01,&this->super_DynamicTypeHandler,attributes_00,propertyKey,pSVar6);
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    bVar2 = DynamicObject::HasObjectArray((DynamicObject *)TStack_20.ptr);
    if ((bVar2) &&
       (bVar2 = PropertyRecord::IsNumeric((PropertyRecord *)library),
       instance_00.ptr = TStack_20.ptr, bVar2)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)library);
      this_local._4_4_ =
           DynamicTypeHandler::SetItemAttributes
                     (&this->super_DynamicTypeHandler,(DynamicObject *)instance_00.ptr,index,
                      descriptor._3_1_);
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        if (!GetIsLocked())
        {
            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (attributes & PropertyLetConstGlobal)
                {
                    Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                    // Need to implement type transition to DictionaryTypeHandler in the case of
                    // shadowing a var or global property with a let in a new script body.
                    Throw::NotImplemented();
                }
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    Assert(!(attributes & PropertyLetConstGlobal));
                    Assert(false);
                }

                if (descriptor->Attributes & PropertyDeleted)
                {
                    return false;
                }

                descriptor->Attributes = (descriptor->Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);

                if (attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }

                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, library->GetScriptContext());

                return true;
            }

            // Check numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemAttributes(instance, propertyRecord->GetNumericValue(), attributes);
            }
        }
        else
        {
            return ConvertToNonSharedSimpleDictionaryType(instance)->SetAttributes(instance, propertyId, attributes);
        }
        return false;
    }